

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

size_t lua_objlen(lua_State *L,int idx)

{
  MSize MVar1;
  TValue *t;
  GCstr *pGVar2;
  int in_ESI;
  lua_State *in_RDI;
  GCstr *s;
  TValue *o;
  cTValue *in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  ulong local_70;
  
  t = index2adr(in_RDI,in_ESI);
  if ((t->field_2).it == 0xfffffffb) {
    local_70 = (ulong)*(uint *)((ulong)(t->u32).lo + 0xc);
  }
  else if ((t->field_2).it == 0xfffffff4) {
    MVar1 = lj_tab_len((GCtab *)&t->field_2);
    local_70 = (ulong)MVar1;
  }
  else if ((t->field_2).it == 0xfffffff3) {
    local_70 = (ulong)*(uint *)((ulong)(t->u32).lo + 0xc);
  }
  else if ((t->field_2).it < 0xffff0000) {
    pGVar2 = lj_strfmt_number(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    (t->u32).lo = (uint32_t)pGVar2;
    (t->field_2).it = 0xfffffffb;
    local_70 = (ulong)pGVar2->len;
  }
  else {
    local_70 = 0;
  }
  return local_70;
}

Assistant:

LUA_API size_t lua_objlen(lua_State *L, int idx)
{
  TValue *o = index2adr(L, idx);
  if (tvisstr(o)) {
    return strV(o)->len;
  } else if (tvistab(o)) {
    return (size_t)lj_tab_len(tabV(o));
  } else if (tvisudata(o)) {
    return udataV(o)->len;
  } else if (tvisnumber(o)) {
    GCstr *s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
    return s->len;
  } else {
    return 0;
  }
}